

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
* Lib::
  iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
            (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             *p)

{
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_RSI;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  *in_RDI;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  *this;
  IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_RDI,
             (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_RDI);
  IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  ::IterPointer(&this->_iter,
                (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)in_RDI);
  iterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>
            (in_stack_ffffffffffffffd8);
  IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  ::~IterPointer((IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                  *)0x3e8494);
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(in_RSI);
  return this;
}

Assistant:

auto iterPointer(P p) { return iterTraits(IterPointer<P>(std::move(p))); }